

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::Test::HasSameFixtureClass(void)

{
  TypeId pvVar1;
  TypeId pvVar2;
  UnitTestImpl *this;
  TestCase *this_00;
  vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *this_01;
  const_reference ppTVar3;
  TestInfo *pTVar4;
  TypeId pvVar5;
  TypeId pvVar6;
  AssertHelper *pAVar7;
  Message *pMVar8;
  Message *pMVar9;
  AssertHelper *this_02;
  char *TEST_F_name;
  char *TEST_name;
  bool this_is_TEST;
  bool first_is_TEST;
  char *this_test_name;
  TypeId this_fixture_id;
  TestInfo *this_test_info;
  char *first_test_name;
  TypeId first_fixture_id;
  TestInfo *first_test_info;
  TestCase *test_case;
  UnitTestImpl *impl;
  char (*in_stack_fffffffffffffe48) [64];
  AssertHelper *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe68;
  int iVar10;
  char *in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  Type TVar11;
  AssertHelper *in_stack_fffffffffffffe80;
  Message *in_stack_fffffffffffffec8;
  AssertHelper *in_stack_fffffffffffffed0;
  bool local_1;
  
  TVar11 = (Type)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  iVar10 = (int)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  this = internal::GetUnitTestImpl();
  this_00 = internal::UnitTestImpl::current_test_case(this);
  this_01 = TestCase::test_info_list(this_00);
  ppTVar3 = std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::operator[]
                      (this_01,0);
  pvVar1 = (*ppTVar3)->fixture_class_id_;
  TestInfo::name((TestInfo *)0x14d66e);
  pTVar4 = internal::UnitTestImpl::current_test_info(this);
  pvVar2 = pTVar4->fixture_class_id_;
  TestInfo::name((TestInfo *)0x14d6ac);
  if (pvVar2 == pvVar1) {
    local_1 = true;
  }
  else {
    pvVar5 = internal::GetTestTypeId();
    pvVar6 = internal::GetTestTypeId();
    if ((pvVar1 == pvVar5) || (pvVar2 == pvVar6)) {
      Message::Message((Message *)in_stack_fffffffffffffe80);
      Message::operator<<((Message *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      Message::operator<<((Message *)in_stack_fffffffffffffe50,
                          (char (*) [59])in_stack_fffffffffffffe48);
      Message::operator<<((Message *)in_stack_fffffffffffffe50,
                          (char (*) [24])in_stack_fffffffffffffe48);
      TestInfo::test_case_name((TestInfo *)0x14d834);
      Message::operator<<((Message *)in_stack_fffffffffffffe50,(char **)in_stack_fffffffffffffe48);
      Message::operator<<((Message *)in_stack_fffffffffffffe50,
                          (char (*) [3])in_stack_fffffffffffffe48);
      Message::operator<<((Message *)in_stack_fffffffffffffe50,
                          (char (*) [6])in_stack_fffffffffffffe48);
      Message::operator<<((Message *)in_stack_fffffffffffffe50,(char **)in_stack_fffffffffffffe48);
      Message::operator<<((Message *)in_stack_fffffffffffffe50,
                          (char (*) [30])in_stack_fffffffffffffe48);
      Message::operator<<((Message *)in_stack_fffffffffffffe50,
                          (char (*) [6])in_stack_fffffffffffffe48);
      Message::operator<<((Message *)in_stack_fffffffffffffe50,(char **)in_stack_fffffffffffffe48);
      Message::operator<<((Message *)in_stack_fffffffffffffe50,
                          (char (*) [39])in_stack_fffffffffffffe48);
      pAVar7 = (AssertHelper *)
               Message::operator<<((Message *)in_stack_fffffffffffffe50,
                                   (char (*) [62])in_stack_fffffffffffffe48);
      pMVar8 = Message::operator<<((Message *)in_stack_fffffffffffffe50,
                                   (char (*) [6])in_stack_fffffffffffffe48);
      internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe80,TVar11,in_stack_fffffffffffffe70,iVar10,
                 in_stack_fffffffffffffe60);
      internal::AssertHelper::operator=(pAVar7,pMVar8);
      internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe50);
      Message::~Message((Message *)0x14d9d5);
    }
    else {
      Message::Message((Message *)in_stack_fffffffffffffe80);
      Message::operator<<((Message *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      Message::operator<<((Message *)in_stack_fffffffffffffe50,
                          (char (*) [31])in_stack_fffffffffffffe48);
      TestInfo::test_case_name((TestInfo *)0x14da72);
      Message::operator<<((Message *)in_stack_fffffffffffffe50,(char **)in_stack_fffffffffffffe48);
      Message::operator<<((Message *)in_stack_fffffffffffffe50,
                          (char (*) [3])in_stack_fffffffffffffe48);
      Message::operator<<((Message *)in_stack_fffffffffffffe50,
                          (char (*) [18])in_stack_fffffffffffffe48);
      Message::operator<<((Message *)in_stack_fffffffffffffe50,(char **)in_stack_fffffffffffffe48);
      pAVar7 = (AssertHelper *)
               Message::operator<<((Message *)in_stack_fffffffffffffe50,
                                   (char (*) [11])in_stack_fffffffffffffe48);
      pMVar8 = Message::operator<<((Message *)in_stack_fffffffffffffe50,
                                   (char **)in_stack_fffffffffffffe48);
      TVar11 = (Type)((ulong)pMVar8 >> 0x20);
      pMVar8 = Message::operator<<((Message *)in_stack_fffffffffffffe50,
                                   (char (*) [2])in_stack_fffffffffffffe48);
      pMVar9 = Message::operator<<((Message *)in_stack_fffffffffffffe50,
                                   (char (*) [63])in_stack_fffffffffffffe48);
      iVar10 = (int)((ulong)pMVar9 >> 0x20);
      pMVar9 = Message::operator<<((Message *)in_stack_fffffffffffffe50,
                                   (char (*) [62])in_stack_fffffffffffffe48);
      Message::operator<<((Message *)in_stack_fffffffffffffe50,
                          (char (*) [63])in_stack_fffffffffffffe48);
      this_02 = (AssertHelper *)
                Message::operator<<((Message *)in_stack_fffffffffffffe50,
                                    (char (*) [59])in_stack_fffffffffffffe48);
      internal::AssertHelper::AssertHelper(pAVar7,TVar11,(char *)pMVar8,iVar10,(char *)pMVar9);
      internal::AssertHelper::operator=(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      internal::AssertHelper::~AssertHelper(this_02);
      Message::~Message((Message *)0x14dbe6);
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Test::HasSameFixtureClass() {
  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  const TestCase* const test_case = impl->current_test_case();

  // Info about the first test in the current test case.
  const TestInfo* const first_test_info = test_case->test_info_list()[0];
  const internal::TypeId first_fixture_id = first_test_info->fixture_class_id_;
  const char* const first_test_name = first_test_info->name();

  // Info about the current test.
  const TestInfo* const this_test_info = impl->current_test_info();
  const internal::TypeId this_fixture_id = this_test_info->fixture_class_id_;
  const char* const this_test_name = this_test_info->name();

  if (this_fixture_id != first_fixture_id) {
    // Is the first test defined using TEST?
    const bool first_is_TEST = first_fixture_id == internal::GetTestTypeId();
    // Is this test defined using TEST?
    const bool this_is_TEST = this_fixture_id == internal::GetTestTypeId();

    if (first_is_TEST || this_is_TEST) {
      // The user mixed TEST and TEST_F in this test case - we'll tell
      // him/her how to fix it.

      // Gets the name of the TEST and the name of the TEST_F.  Note
      // that first_is_TEST and this_is_TEST cannot both be true, as
      // the fixture IDs are different for the two tests.
      const char* const TEST_name =
          first_is_TEST ? first_test_name : this_test_name;
      const char* const TEST_F_name =
          first_is_TEST ? this_test_name : first_test_name;

      ADD_FAILURE()
          << "All tests in the same test case must use the same test fixture\n"
          << "class, so mixing TEST_F and TEST in the same test case is\n"
          << "illegal.  In test case " << this_test_info->test_case_name()
          << ",\n"
          << "test " << TEST_F_name << " is defined using TEST_F but\n"
          << "test " << TEST_name << " is defined using TEST.  You probably\n"
          << "want to change the TEST to TEST_F or move it to another test\n"
          << "case.";
    } else {
      // The user defined two fixture classes with the same name in
      // two namespaces - we'll tell him/her how to fix it.
      ADD_FAILURE()
          << "All tests in the same test case must use the same test fixture\n"
          << "class.  However, in test case "
          << this_test_info->test_case_name() << ",\n"
          << "you defined test " << first_test_name
          << " and test " << this_test_name << "\n"
          << "using two different test fixture classes.  This can happen if\n"
          << "the two classes are from different namespaces or translation\n"
          << "units and have the same name.  You should probably rename one\n"
          << "of the classes to put the tests into different test cases.";
    }
    return false;
  }

  return true;
}